

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  value *this;
  undefined8 uVar3;
  ostream *poVar4;
  char **in_RSI;
  int in_EDI;
  exception *e;
  service srv;
  char *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  value *in_stack_fffffffffffffeb8;
  function<void_()> *in_stack_fffffffffffffec0;
  char *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  submitter local_d8;
  submitter local_d0 [4];
  undefined1 local_b0 [20];
  int local_9c;
  string local_98 [32];
  string local_78 [32];
  undefined1 local_58 [16];
  string local_48 [48];
  service local_18 [20];
  uint local_4;
  
  local_4 = 0;
  cppcms::service::service(local_18,in_EDI,in_RSI);
  this = (value *)cppcms::service::settings();
  cppcms::json::value::get_abi_cxx11_
            (this,(char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08);
  bVar1 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::__cxx11::string::~string(local_48);
  if ((bVar1 & 1) == 0) {
    cppcms::service::settings();
    cppcms::json::value::get<std::__cxx11::string>
              (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
    bVar2 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(local_78);
    if (bVar2) {
      is_async = true;
      poVar4 = std::operator<<((ostream *)&std::cout,"Asynchronous testing");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      cppcms::service::settings();
      cppcms::json::value::get<std::__cxx11::string>
                (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
      bVar2 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      std::__cxx11::string::~string(local_98);
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Invalid configuration value of test.async");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_4 = 1;
        local_9c = 1;
        goto LAB_001089d8;
      }
      is_async = true;
      is_nonblocking = true;
      poVar4 = std::operator<<((ostream *)&std::cout,"Non blocking testing");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    in_stack_fffffffffffffec0 = (function<void_()> *)cppcms::service::applications_pool();
    cppcms::create_pool<unit_test>();
    cppcms::applications_pool::mount(in_stack_fffffffffffffec0,local_b0,1);
    std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
              ((shared_ptr<cppcms::application_specific_pool> *)0x108944);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Synchronous testing");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    uVar3 = cppcms::service::applications_pool();
    cppcms::create_pool<unit_test>();
    cppcms::applications_pool::mount(uVar3,local_58,0);
    std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
              ((shared_ptr<cppcms::application_specific_pool> *)0x1086ac);
  }
  submitter::submitter(&local_d8,local_18);
  std::function<void()>::function<submitter,void>(in_stack_fffffffffffffec0,local_d0);
  cppcms::service::after_fork((function *)local_18);
  std::function<void_()>::~function((function<void_()> *)0x1089be);
  cppcms::service::run();
  local_9c = 0;
LAB_001089d8:
  cppcms::service::~service(local_18);
  if (local_9c == 0) {
    local_4 = (uint)((run_ok & 1U) == 0);
  }
  return local_4;
}

Assistant:

int main(int argc,char **argv)
{
	try {
		cppcms::service srv(argc,argv);
		if(srv.settings().get("test.async","sync")=="sync") {
			std::cout << "Synchronous testing" << std::endl;
			srv.applications_pool().mount( cppcms::create_pool<unit_test>());
		}
		else {
			if(srv.settings().get<std::string>("test.async")=="async") {
				is_async = true;
				std::cout << "Asynchronous testing" << std::endl;
			}
			else if(srv.settings().get<std::string>("test.async")=="nonblocking") {
				is_async = true;
				is_nonblocking = true;
				std::cout << "Non blocking testing" << std::endl;
			}
			else {
				std::cerr << "Invalid configuration value of test.async" << std::endl;
				return 1;
			}
			srv.applications_pool().mount( cppcms::create_pool<unit_test>(),cppcms::app::asynchronous);
		}
		srv.after_fork(submitter(srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	return run_ok ? EXIT_SUCCESS : EXIT_FAILURE;
}